

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_psbt.cpp
# Opt level: O2

void cfd::js::api::AddPsbtOutput(Psbt *psbt,PsbtAddOutputRequestStruct *request)

{
  pointer pPVar1;
  uint uVar2;
  pointer pPVar3;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> key_list;
  AddressFactory_conflict factory;
  Script redeem_script;
  Address addr;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> local_238;
  AddressFactory local_218;
  Amount local_1f0 [16];
  Script local_1e0;
  Script local_1a8 [6];
  
  uVar2 = cfd::core::Psbt::GetTxOutCount();
  local_238.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_238.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_238.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cfd::core::Script::Script(&local_1e0);
  ParsePsbtOutputRequest(&request->output,&local_238,&local_1e0);
  if ((request->txout).address._M_string_length == 0) {
    cfd::core::Script::Script(local_1a8,(string *)&(request->txout).direct_locking_script);
    cfd::core::Amount::Amount((Amount *)&local_218,(request->txout).amount);
    cfd::core::Psbt::AddTxOut((Script *)psbt,(Amount *)local_1a8);
    core::Script::~Script(local_1a8);
    cfd::core::Psbt::SetTxOutData((uint)psbt,(Script *)(ulong)uVar2,(vector *)&local_1e0);
  }
  else {
    cfd::AddressFactory::AddressFactory(&local_218);
    cfd::AddressFactory::GetAddress((string *)local_1a8);
    cfd::core::Amount::Amount(local_1f0,(request->txout).amount);
    cfd::Psbt::AddTxOutData((Amount *)psbt,(Address *)local_1f0,local_1a8,(vector *)&local_1e0);
    core::Address::~Address((Address *)local_1a8);
    AddressFactory::~AddressFactory(&local_218);
  }
  pPVar1 = (request->output).unknown.
           super__Vector_base<cfd::js::api::PsbtMapDataStruct,_std::allocator<cfd::js::api::PsbtMapDataStruct>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pPVar3 = (request->output).unknown.
                super__Vector_base<cfd::js::api::PsbtMapDataStruct,_std::allocator<cfd::js::api::PsbtMapDataStruct>_>
                ._M_impl.super__Vector_impl_data._M_start; pPVar3 != pPVar1; pPVar3 = pPVar3 + 1) {
    cfd::core::ByteData::ByteData((ByteData *)local_1a8,(string *)pPVar3);
    cfd::core::ByteData::ByteData((ByteData *)&local_218,(string *)&pPVar3->value);
    cfd::core::Psbt::SetTxOutRecord((uint)psbt,(ByteData *)(ulong)uVar2,(ByteData *)local_1a8);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_218);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a8);
  }
  core::Script::~Script(&local_1e0);
  std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector(&local_238);
  return;
}

Assistant:

void AddPsbtOutput(Psbt* psbt, const PsbtAddOutputRequestStruct& request) {
  uint32_t index = psbt->GetTxOutCount();

  std::vector<KeyData> key_list;
  Script redeem_script;
  ParsePsbtOutputRequest(request.output, &key_list, &redeem_script);

  if (!request.txout.address.empty()) {
    AddressFactory factory;
    auto addr = factory.GetAddress(request.txout.address);
    psbt->AddTxOutData(
        Amount(request.txout.amount), addr, redeem_script, key_list);
  } else {
    psbt->AddTxOut(
        Script(request.txout.direct_locking_script),
        Amount(request.txout.amount));
    psbt->SetTxOutData(index, redeem_script, key_list);
  }

  for (const auto& data : request.output.unknown) {
    psbt->SetTxOutRecord(index, ByteData(data.key), ByteData(data.value));
  }
}